

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitStringTemplate(ParseNodeStrTemplate *pnodeStrTemplate,ByteCodeGenerator *byteCodeGenerator,
                       FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  ParseNodeBin *pPVar6;
  ParseNodeStr *pPVar7;
  ByteCodeWriter *this;
  RegSlot RVar8;
  ParseNode *this_00;
  ParseNodePtr this_01;
  ParseNodePtr pPVar9;
  
  if (pnodeStrTemplate->pnodeStringLiterals == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x231b,"(pnodeStrTemplate->pnodeStringLiterals)",
                       "pnodeStrTemplate->pnodeStringLiterals");
    if (!bVar2) goto LAB_00812285;
    *puVar5 = 0;
  }
  if ((pnodeStrTemplate->field_0x2a & 1) == 0) {
    if (pnodeStrTemplate->pnodeSubstitutionExpressions == (ParseNodePtr)0x0) {
      if (pnodeStrTemplate->pnodeStringLiterals->nop == knopList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2324,"(pnodeStrTemplate->pnodeStringLiterals->nop != knopList)",
                           "pnodeStrTemplate->pnodeStringLiterals->nop != knopList");
        if (!bVar2) goto LAB_00812285;
        *puVar5 = 0;
      }
      FuncInfo::AcquireLoc(funcInfo,&pnodeStrTemplate->super_ParseNode);
      Emit(pnodeStrTemplate->pnodeStringLiterals,byteCodeGenerator,funcInfo,0,false,false);
      RVar8 = (pnodeStrTemplate->super_ParseNode).location;
      RVar4 = pnodeStrTemplate->pnodeStringLiterals->location;
      if (RVar8 == RVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2329,
                           "(pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location)"
                           ,
                           "pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location"
                          );
        if (!bVar2) goto LAB_00812285;
        *puVar5 = 0;
        RVar8 = (pnodeStrTemplate->super_ParseNode).location;
        RVar4 = pnodeStrTemplate->pnodeStringLiterals->location;
      }
      Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,RVar8,RVar4);
      FuncInfo::ReleaseLoc(funcInfo,pnodeStrTemplate->pnodeStringLiterals);
      return;
    }
    FuncInfo::AcquireLoc(funcInfo,&pnodeStrTemplate->super_ParseNode);
    this_00 = pnodeStrTemplate->pnodeStringLiterals;
    if (this_00->nop != knopList) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x2334,"(pnodeStrTemplate->pnodeStringLiterals->nop == knopList)",
                         "First string in the list must be a knopList node.");
      if (!bVar2) goto LAB_00812285;
      *puVar5 = 0;
      this_00 = pnodeStrTemplate->pnodeStringLiterals;
    }
    pPVar6 = ParseNode::AsParseNodeBin(this_00);
    pPVar7 = ParseNode::AsParseNodeStr(pPVar6->pnode1);
    bVar2 = pPVar7->pid->m_cch == 0;
    if (!bVar2) {
      pPVar6 = ParseNode::AsParseNodeBin(this_00);
      Emit(pPVar6->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      RVar8 = (pnodeStrTemplate->super_ParseNode).location;
      pPVar6 = ParseNode::AsParseNodeBin(this_00);
      if (RVar8 == pPVar6->pnode1->location) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2344,
                           "(pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location)"
                           ,
                           "pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location"
                          );
        if (!bVar3) {
LAB_00812285:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      RVar8 = (pnodeStrTemplate->super_ParseNode).location;
      pPVar6 = ParseNode::AsParseNodeBin(this_00);
      Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,RVar8,pPVar6->pnode1->location);
      pPVar6 = ParseNode::AsParseNodeBin(this_00);
      FuncInfo::ReleaseLoc(funcInfo,pPVar6->pnode1);
    }
    if (this_00->nop == knopList) {
      this_01 = pnodeStrTemplate->pnodeSubstitutionExpressions;
      this = &byteCodeGenerator->m_writer;
      do {
        pPVar9 = this_01;
        if (this_01->nop == knopList) {
          pPVar6 = ParseNode::AsParseNodeBin(this_01);
          pPVar9 = pPVar6->pnode1;
          pPVar6 = ParseNode::AsParseNodeBin(this_01);
          this_01 = pPVar6->pnode2;
        }
        Emit(pPVar9,byteCodeGenerator,funcInfo,0,false,false);
        if (bVar2) {
          Js::ByteCodeWriter::Reg2
                    (this,Conv_Str,(pnodeStrTemplate->super_ParseNode).location,pPVar9->location);
        }
        else {
          RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
          Js::ByteCodeWriter::Reg2(this,Conv_Str,RVar4,pPVar9->location);
          RVar8 = (pnodeStrTemplate->super_ParseNode).location;
          Js::ByteCodeWriter::Reg3(this,Add_A,RVar8,RVar8,RVar4);
          FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
        }
        FuncInfo::ReleaseLoc(funcInfo,pPVar9);
        pPVar6 = ParseNode::AsParseNodeBin(this_00);
        this_00 = pPVar6->pnode2;
        pPVar9 = this_00;
        if (this_00->nop == knopList) {
          pPVar6 = ParseNode::AsParseNodeBin(this_00);
          pPVar9 = pPVar6->pnode1;
        }
        pPVar7 = ParseNode::AsParseNodeStr(pPVar9);
        if (pPVar7->pid->m_cch != 0) {
          Emit(pPVar9,byteCodeGenerator,funcInfo,0,false,false);
          RVar8 = (pnodeStrTemplate->super_ParseNode).location;
          Js::ByteCodeWriter::Reg3(this,Add_A,RVar8,RVar8,pPVar9->location);
          FuncInfo::ReleaseLoc(funcInfo,pPVar9);
        }
        bVar2 = false;
      } while (this_00->nop == knopList);
    }
  }
  return;
}

Assistant:

void EmitStringTemplate(ParseNodeStrTemplate *pnodeStrTemplate, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Assert(pnodeStrTemplate->pnodeStringLiterals);

    // For a tagged string template, we will create the callsite constant object as part of the FunctionBody constants table.
    // We only need to emit code for non-tagged string templates here.
    if (!pnodeStrTemplate->isTaggedTemplate)
    {
        // If we have no substitutions and this is not a tagged template, we can emit just the single cooked string.
        if (pnodeStrTemplate->pnodeSubstitutionExpressions == nullptr)
        {
            Assert(pnodeStrTemplate->pnodeStringLiterals->nop != knopList);

            funcInfo->AcquireLoc(pnodeStrTemplate);
            Emit(pnodeStrTemplate->pnodeStringLiterals, byteCodeGenerator, funcInfo, false);

            Assert(pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location);

            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, pnodeStrTemplate->location, pnodeStrTemplate->pnodeStringLiterals->location);
            funcInfo->ReleaseLoc(pnodeStrTemplate->pnodeStringLiterals);
        }
        else
        {
            // If we have substitutions but no tag function, we can skip the callSite object construction (and also ignore raw strings).
            funcInfo->AcquireLoc(pnodeStrTemplate);

            // First string must be a list node since we have substitutions.
            AssertMsg(pnodeStrTemplate->pnodeStringLiterals->nop == knopList, "First string in the list must be a knopList node.");

            ParseNode* stringNodeList = pnodeStrTemplate->pnodeStringLiterals;

            // Emit the first string and load that into the pnode location.
            // skip loading the string if it is empty
            ParseNode* firstString = stringNodeList->AsParseNodeBin()->pnode1;
            bool skippedFirst = false;
            if (firstString->AsParseNodeStr()->pid->Cch() == 0)
            {
                skippedFirst = true;
            }
            else
            {
                Emit(stringNodeList->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);

                Assert(pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location);

                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, pnodeStrTemplate->location, stringNodeList->AsParseNodeBin()->pnode1->location);
                funcInfo->ReleaseLoc(stringNodeList->AsParseNodeBin()->pnode1);
            }


            ParseNode* expressionNodeList = pnodeStrTemplate->pnodeSubstitutionExpressions;
            ParseNode* stringNode;
            ParseNode* expressionNode;

            // Now append the substitution expressions and remaining string constants via normal add operator
            // We will always have one more string constant than substitution expression
            // `strcon1 ${expr1} strcon2 ${expr2} strcon3` = strcon1 + expr1 + strcon2 + expr2 + strcon3
            //
            // strcon1 --- step 1 (above)
            // expr1   \__ step 2
            // strcon2 /
            // expr2   \__ step 3
            // strcon3 /
            while (stringNodeList->nop == knopList)
            {
                // If the current head of the expression list is a list, fetch the node and walk the list.
                if (expressionNodeList->nop == knopList)
                {
                    expressionNode = expressionNodeList->AsParseNodeBin()->pnode1;
                    expressionNodeList = expressionNodeList->AsParseNodeBin()->pnode2;
                }
                else
                {
                    // This is the last element of the expression list.
                    expressionNode = expressionNodeList;
                }

                // Emit the expression and append it to the string we're building.
                Emit(expressionNode, byteCodeGenerator, funcInfo, false);

                // if this is the first expression AND the initial string was empty write directly to the pnodeStrTemplate location
                if (skippedFirst == true)
                {
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Str, pnodeStrTemplate->location, expressionNode->location);
                    skippedFirst = false;
                }
                else
                {
                    Js::RegSlot toStringLocation = funcInfo->AcquireTmpRegister();
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Str, toStringLocation, expressionNode->location);
                    byteCodeGenerator->Writer()->Reg3(Js::OpCode::Add_A, pnodeStrTemplate->location, pnodeStrTemplate->location, toStringLocation);
                    funcInfo->ReleaseTmpRegister(toStringLocation);
                }

                funcInfo->ReleaseLoc(expressionNode);

                // Move to the next string in the list - we already got ahead of the expressions in the first string literal above.
                stringNodeList = stringNodeList->AsParseNodeBin()->pnode2;

                // If the current head of the string literal list is also a list node, need to fetch the actual string literal node.
                if (stringNodeList->nop == knopList)
                {
                    stringNode = stringNodeList->AsParseNodeBin()->pnode1;
                }
                else
                {
                    // This is the last element of the string literal list.
                    stringNode = stringNodeList;
                }

                // Emit the string node following the previous expression and append it to the string.
                // This is either just some string in the list or it is the last string.
                if (stringNode->AsParseNodeStr()->pid->Cch() != 0)
                {
                    Emit(stringNode, byteCodeGenerator, funcInfo, false);
                    byteCodeGenerator->Writer()->Reg3(Js::OpCode::Add_A, pnodeStrTemplate->location, pnodeStrTemplate->location, stringNode->location);
                    funcInfo->ReleaseLoc(stringNode);
                }
            }
        }
    }
}